

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

str pybind11::detail::enum_name(handle arg)

{
  handle h;
  PyObject *pPVar1;
  bool bVar2;
  int iVar3;
  object *poVar4;
  long in_RSI;
  PyObject *in_RDI;
  dict entries;
  dict_iterator __begin2;
  handle local_a8;
  handle local_a0;
  handle local_98;
  handle local_90;
  PyObject *local_88;
  handle local_80;
  PyObject *pPStack_78;
  handle local_70;
  accessor<pybind11::detail::accessor_policies::generic_item> local_68;
  PyObject *local_48;
  object_api<pybind11::handle> local_40 [8];
  object local_38;
  
  local_80.m_ptr = *(PyObject **)(in_RSI + 8);
  pPStack_78 = (PyObject *)0x1f8f29;
  local_70.m_ptr = (PyObject *)0x0;
  dict::dict<pybind11::detail::accessor_policies::str_attr>
            ((dict *)&local_a0,(accessor<pybind11::detail::accessor_policies::str_attr> *)&local_88)
  ;
  local_98.m_ptr = in_RDI;
  object::~object((object *)&local_70);
  local_88 = local_a0.m_ptr;
  local_80.m_ptr = (PyObject *)0x0;
  pPStack_78 = (PyObject *)0x0;
  local_70.m_ptr = (PyObject *)0x0;
  iVar3 = PyDict_Next();
  if ((iVar3 != 0) && (local_70.m_ptr != (PyObject *)0xffffffffffffffff)) {
    do {
      pPVar1 = pPStack_78;
      h.m_ptr = local_80.m_ptr;
      int_::int_<int,_0>((int_ *)&local_90,0);
      if (local_90.m_ptr != (PyObject *)0x0) {
        (local_90.m_ptr)->ob_refcnt = (local_90.m_ptr)->ob_refcnt + 1;
      }
      local_68.obj.m_ptr = pPVar1;
      local_68.key.super_handle.m_ptr = (handle)(handle)local_90.m_ptr;
      local_38.super_handle.m_ptr = (handle)(PyObject *)0x0;
      local_68.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
      object::~object(&local_38);
      poVar4 = accessor<pybind11::detail::accessor_policies::generic_item>::get_cache(&local_68);
      local_a8.m_ptr = (poVar4->super_handle).m_ptr;
      if (local_a8.m_ptr == (PyObject *)0x0) {
        local_48 = (PyObject *)0x0;
      }
      else {
        (local_a8.m_ptr)->ob_refcnt = (local_a8.m_ptr)->ob_refcnt + 1;
        local_48 = local_a8.m_ptr;
      }
      bVar2 = object_api<pybind11::handle>::rich_compare
                        ((object_api<pybind11::handle> *)&local_48,local_40,2);
      object::~object((object *)&local_a8);
      object::~object(&local_68.cache);
      object::~object(&local_68.key);
      object::~object((object *)&local_90);
      if (bVar2) {
        str::str((str *)local_98.m_ptr,h);
        goto LAB_001b70ee;
      }
      iVar3 = PyDict_Next(local_88,&local_70,&local_80,&pPStack_78);
    } while ((iVar3 != 0) && (local_70.m_ptr != (PyObject *)0xffffffffffffffff));
  }
  str::str((str *)local_98.m_ptr,"???");
LAB_001b70ee:
  object::~object((object *)&local_a0);
  return (str)local_98.m_ptr;
}

Assistant:

inline str enum_name(handle arg) {
    dict entries = arg.get_type().attr("__entries");
    for (auto kv : entries) {
        if (handle(kv.second[int_(0)]).equal(arg))
            return pybind11::str(kv.first);
    }
    return "???";
}